

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepLoop *L)

{
  int local_28;
  int local_24;
  int t1;
  int t0;
  ON_BrepLoop *L_local;
  ON_Brep *this_local;
  
  if (L->m_loop_index < 0) {
    this_local._7_1_ = false;
  }
  else if (L->m_type == slit) {
    this_local._7_1_ = true;
  }
  else {
    _t1 = L;
    L_local = (ON_BrepLoop *)this;
    this_local._7_1_ = FoundSlitPair(L,&local_24,&local_28);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepLoop& L) const

{
  if (L.m_loop_index < 0)
    return false;
  if (L.m_type == ON_BrepLoop::slit)
    return true;
  int t0, t1;
  return FoundSlitPair(L, &t0, &t1);
}